

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTest<WordSplitOnceTest,_testing::internal::TemplateSel<WordSplitOnceTest_random_Test>,_testing::internal::Types<char,_unsigned_char,_signed_char,_wchar_t,_char8_t,_char16_t,_char32_t>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  pointer pbVar1;
  size_type *psVar2;
  pointer pcVar3;
  CodeLocation CVar4;
  _Alloc_hider _Var5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  SetUpTearDownSuiteFuncType p_Var8;
  SetUpTearDownSuiteFuncType p_Var9;
  undefined8 *puVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  size_t __n;
  type_info *ptVar13;
  char *pcVar14;
  long lVar15;
  type_info *ptVar16;
  type_info *ptVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 in_stack_fffffffffffffe78;
  type_info *in_stack_fffffffffffffe80;
  type_info *ptVar20;
  type_info *ptVar21;
  type_info *in_stack_fffffffffffffe88;
  TestFactoryBase *pTVar22;
  type_info local_170;
  undefined7 uStack_16f;
  undefined8 uStack_168;
  int local_15c;
  char *local_158;
  size_type *local_150;
  size_type local_148;
  size_type local_140;
  undefined8 uStack_138;
  type_info *local_130;
  type_info *local_128;
  long local_120;
  undefined8 uStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  char *local_b0;
  size_type *local_a8;
  char *local_a0;
  long *local_98 [2];
  long local_88 [2];
  int local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_158 = case_name;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,prefix,(allocator<char> *)&stack0xfffffffffffffe7f);
  pcVar14 = "/";
  if (*prefix == '\0') {
    pcVar14 = "";
  }
  local_a0 = prefix;
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50,pcVar14);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_110._M_dataplus._M_p = (pointer)paVar12;
  }
  local_110._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_110,local_158);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_f0._M_dataplus._M_p = (pointer)paVar12;
  }
  local_f0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f0,"/");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_d0._M_dataplus._M_p = (pointer)paVar12;
  }
  local_d0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar1 = (type_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d0,pbVar1[index]._M_dataplus._M_p,pbVar1[index]._M_string_length);
  local_150 = &local_140;
  psVar2 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar12 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2 == paVar12) {
    local_140 = paVar12->_M_allocated_capacity;
    uStack_138 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_140 = paVar12->_M_allocated_capacity;
    local_150 = psVar2;
  }
  local_148 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  local_a8 = local_150;
  pcVar14 = strchr(test_names,0x2c);
  if (pcVar14 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffe80,test_names,(allocator<char> *)&local_70);
    ptVar13 = extraout_RDX_00;
  }
  else {
    in_stack_fffffffffffffe80 = &local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe80,test_names,pcVar14);
    ptVar13 = extraout_RDX;
  }
  local_128 = in_stack_fffffffffffffe88;
  local_15c = index;
  local_b0 = test_names;
  if (in_stack_fffffffffffffe88 != (type_info *)0x0) {
    ptVar16 = in_stack_fffffffffffffe88 + (long)in_stack_fffffffffffffe80;
    ptVar21 = in_stack_fffffffffffffe80;
    do {
      ptVar20 = ptVar21;
      iVar6 = isspace((uint)(byte)ptVar16[-1]);
      ptVar13 = extraout_RDX_01;
      in_stack_fffffffffffffe80 = ptVar21;
      local_128 = in_stack_fffffffffffffe88;
      if (iVar6 == 0) break;
      ptVar17 = ptVar16 + -1;
      lVar15 = (long)ptVar17 - (long)ptVar21;
      in_stack_fffffffffffffe80 = ptVar20;
      if ((in_stack_fffffffffffffe88 != (type_info *)(lVar15 + 1)) &&
         (__n = (long)in_stack_fffffffffffffe88 - (lVar15 + 1), __n != 0)) {
        ptVar13 = ptVar21 + lVar15;
        if (__n == 1) {
          *ptVar13 = ptVar13[1];
        }
        else {
          memmove(ptVar13,ptVar21 + lVar15 + 1,__n);
          in_stack_fffffffffffffe80 = ptVar20;
        }
      }
      ptVar13 = in_stack_fffffffffffffe88 + -1;
      (in_stack_fffffffffffffe80 + -1)[(long)in_stack_fffffffffffffe88] = (type_info)0x0;
      ptVar16 = in_stack_fffffffffffffe80 + lVar15;
      bVar18 = ptVar17 != ptVar21;
      ptVar21 = in_stack_fffffffffffffe80;
      in_stack_fffffffffffffe88 = ptVar13;
      local_128 = ptVar13;
    } while (bVar18);
  }
  ptVar21 = &local_170;
  if (in_stack_fffffffffffffe80 == ptVar21) {
    uStack_118 = uStack_168;
    in_stack_fffffffffffffe80 = (type_info *)&local_120;
  }
  local_120 = CONCAT71(uStack_16f,local_170);
  pTVar22 = (TestFactoryBase *)0x0;
  local_170 = (type_info)0x0;
  local_130 = in_stack_fffffffffffffe80;
  GetTypeName_abi_cxx11_(&local_70,(internal *)&char::typeinfo,ptVar13);
  _Var5._M_p = local_70._M_dataplus._M_p;
  local_98[0] = local_88;
  pcVar3 = (code_location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar3,pcVar3 + (code_location->file)._M_string_length);
  local_78 = code_location->line;
  p_Var8 = SuiteApiResolver<WordSplitOnceTest_random_Test<char>_>::GetSetUpCaseOrSuite
                     ((code_location->file)._M_dataplus._M_p,local_78);
  p_Var9 = SuiteApiResolver<WordSplitOnceTest_random_Test<char>_>::GetTearDownCaseOrSuite
                     ((code_location->file)._M_dataplus._M_p,code_location->line);
  uVar19 = 0x3c191a;
  puVar10 = (undefined8 *)operator_new(8);
  *puVar10 = &PTR__TestFactoryBase_00563a38;
  CVar4.file._M_string_length = (size_type)p_Var9;
  CVar4.file._M_dataplus._M_p = (pointer)p_Var8;
  CVar4.file.field_2._M_allocated_capacity = (size_type)puVar10;
  CVar4.file.field_2._8_8_ = uVar19;
  CVar4._32_8_ = in_stack_fffffffffffffe78;
  testing::internal::MakeAndRegisterTestInfo
            ((char *)local_a8,(char *)in_stack_fffffffffffffe80,_Var5._M_p,(char *)0x0,CVar4,
             local_98,(_func_void *)&TypeIdHelper<WordSplitOnceTest<char>>::dummy_,
             (_func_void *)ptVar21,pTVar22);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != (type_info *)&local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (ptVar21 != &local_170) {
    operator_delete(ptVar21,CONCAT71(uStack_16f,local_170) + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar18 = TypeParameterizedTest<WordSplitOnceTest,_testing::internal::TemplateSel<WordSplitOnceTest_random_Test>,_testing::internal::Types<unsigned_char,_signed_char,_wchar_t,_char8_t,_char16_t,_char32_t>_>
           ::Register(local_a0,code_location,local_158,local_b0,local_15c + 1,type_names);
  return bVar18;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }